

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_dophase_done(Curl_easy *data,_Bool connected)

{
  undefined1 *puVar1;
  connectdata *conn;
  FILEPROTO *pFVar2;
  CURLcode CVar3;
  undefined7 in_register_00000031;
  int completed;
  
  conn = data->conn;
  pFVar2 = (data->req).p.file;
  if ((int)CONCAT71(in_register_00000031,connected) == 0) {
    if (pFVar2->fd == 0) {
      puVar1 = &(conn->bits).field_0x5;
      *puVar1 = *puVar1 | 0x40;
      goto LAB_0011ca3e;
    }
  }
  else {
    CVar3 = ftp_do_more(data,&completed);
    if (CVar3 != CURLE_OK) {
      close_secondarysocket(data,conn);
      return CVar3;
    }
    if (pFVar2->fd == 0) goto LAB_0011ca3e;
  }
  Curl_setup_transfer(data,-1,-1,false,-1);
LAB_0011ca3e:
  (conn->proto).ftpc.ctl_valid = true;
  return CURLE_OK;
}

Assistant:

static CURLcode ftp_dophase_done(struct Curl_easy *data, bool connected)
{
  struct connectdata *conn = data->conn;
  struct FTP *ftp = data->req.p.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  if(connected) {
    int completed;
    CURLcode result = ftp_do_more(data, &completed);

    if(result) {
      close_secondarysocket(data, conn);
      return result;
    }
  }

  if(ftp->transfer != PPTRANSFER_BODY)
    /* no data to transfer */
    Curl_setup_transfer(data, -1, -1, FALSE, -1);
  else if(!connected)
    /* since we didn't connect now, we want do_more to get called */
    conn->bits.do_more = TRUE;

  ftpc->ctl_valid = TRUE; /* seems good */

  return CURLE_OK;
}